

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

QString * __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_const_QString_&>
::convertTo<QString>
          (QString *__return_storage_ptr__,
          QStringBuilder<QStringBuilder<QStringBuilder<const_QString_&,_char16_t>,_const_QString_&>,_const_QString_&>
          *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char16_t *pcVar4;
  QString *pQVar5;
  char16_t *pcVar6;
  
  lVar1 = (((this->a).a.a)->d).size;
  lVar2 = (((this->a).b)->d).size;
  lVar3 = (this->b->d).size;
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::QString(__return_storage_ptr__,lVar3 + lVar1 + lVar2 + 1,Uninitialized);
  pcVar4 = (__return_storage_ptr__->d).ptr;
  pQVar5 = (this->a).a.a;
  lVar1 = (pQVar5->d).size;
  if (lVar1 != 0) {
    pcVar6 = (pQVar5->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar4,pcVar6,lVar1 * 2);
  }
  pcVar4 = pcVar4 + lVar1;
  *pcVar4 = (this->a).a.b;
  pQVar5 = (this->a).b;
  lVar1 = (pQVar5->d).size;
  if (lVar1 != 0) {
    pcVar6 = (pQVar5->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar4 + 1,pcVar6,lVar1 * 2);
  }
  lVar2 = (this->b->d).size;
  if (lVar2 != 0) {
    pcVar6 = (this->b->d).ptr;
    if (pcVar6 == (char16_t *)0x0) {
      pcVar6 = (char16_t *)&QString::_empty;
    }
    memcpy(pcVar4 + 1 + lVar1,pcVar6,lVar2 * 2);
  }
  return __return_storage_ptr__;
}

Assistant:

T convertTo() const
    {
        if (isNull()) {
            // appending two null strings must give back a null string,
            // so we're special casing this one out, QTBUG-114206
            return T();
        }

        const qsizetype len = Concatenable::size(*this);
        T s(len, Qt::Uninitialized);

        // Using data_ptr() here (private API) so we can bypass the
        // isDetached() and the replacement of a null pointer with _empty in
        // both QString and QByteArray's data() and constData(). The result is
        // the same if len != 0.
        auto d = reinterpret_cast<typename T::iterator>(s.data_ptr().data());
        const auto start = d;
        Concatenable::appendTo(*this, d);

        if constexpr (Concatenable::ExactSize) {
            Q_UNUSED(start)
        } else {
            if (len != d - start) {
                // this resize is necessary since we allocate a bit too much
                // when dealing with variable sized 8-bit encodings
                s.resize(d - start);
            }
        }
        return s;
    }